

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_token.c
# Opt level: O1

int StringToken_Split(char *source,size_t length,char **delimiters,size_t n_delims,
                     _Bool include_empty,char ***tokens,size_t *token_count)

{
  size_t sVar1;
  bool bVar2;
  _Bool _Var3;
  int iVar4;
  LOGGER_LOG p_Var5;
  STRING_TOKEN_HANDLE token;
  char **ppcVar6;
  ulong uVar7;
  char *pcVar8;
  size_t __n;
  char *__src;
  ulong __size;
  size_t __size_00;
  
  if (((tokens == (char ***)0x0 || n_delims == 0) ||
      (delimiters == (char **)0x0 || source == (char *)0x0)) || token_count == (size_t *)0x0) {
    p_Var5 = xlogging_get_log_function();
    iVar4 = 0x131;
    if (p_Var5 != (LOGGER_LOG)0x0) {
      (*p_Var5)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                ,"StringToken_Split",0x130,1,
                "Invalid argument (source=%p, delimiters=%p, n_delims=%lu, tokens=%p, token_count=%p)"
                ,source,delimiters,n_delims,tokens,token_count);
      iVar4 = 0x131;
    }
  }
  else {
    token = StringToken_GetFirst(source,length,delimiters,n_delims);
    iVar4 = 0;
    *token_count = 0;
    *tokens = (char **)0x0;
    if (token != (STRING_TOKEN_HANDLE)0x0) {
      iVar4 = 0;
      do {
        pcVar8 = token->token_start;
        if (pcVar8 == token->source + token->length) {
          __src = (char *)0x0;
        }
        else {
          __src = (char *)0x0;
          if (pcVar8 != token->delimiter_start) {
            __src = pcVar8;
          }
        }
        if (token->token_start == (char *)0x0) {
          __n = 0;
        }
        else {
          pcVar8 = token->delimiter_start;
          if (pcVar8 == (char *)0x0) {
            pcVar8 = token->source + token->length;
          }
          __n = (long)pcVar8 - (long)token->token_start;
        }
        if (((__src == (char *)0x0) || (__n != 0)) && ((__src != (char *)0x0 || (__n == 0)))) {
          bVar2 = true;
          if (include_empty || __src != (char *)0x0) {
            sVar1 = *token_count;
            uVar7 = sVar1 + 1;
            *token_count = uVar7;
            uVar7 = uVar7 >> 0x3d;
            __size = -(ulong)(uVar7 != 0) | sVar1 * 8 + 8;
            if ((uVar7 == 0) &&
               (ppcVar6 = (char **)realloc(*tokens,__size), ppcVar6 != (char **)0x0)) {
              *tokens = ppcVar6;
              if (__n == 0) {
                ppcVar6[*token_count - 1] = (char *)0x0;
              }
              else {
                __size_00 = __n + 1;
                if (__size_00 == 0) {
                  __size_00 = 0xffffffffffffffff;
                }
                if (__size_00 != 0xffffffffffffffff) {
                  pcVar8 = (char *)malloc(__size_00);
                  ppcVar6[*token_count - 1] = pcVar8;
                  if (pcVar8 != (char *)0x0) {
                    memcpy(pcVar8,__src,__n);
                    pcVar8[__n] = '\0';
                    goto LAB_0011679f;
                  }
                }
                p_Var5 = xlogging_get_log_function();
                if (p_Var5 != (LOGGER_LOG)0x0) {
                  (*p_Var5)(AZ_LOG_ERROR,
                            "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                            ,"StringToken_Split",0x16c,1,"Failed copying token into array, size=%zu"
                            ,__size_00);
                }
                *token_count = *token_count - 1;
                iVar4 = 0x16e;
                bVar2 = false;
              }
            }
            else {
              p_Var5 = xlogging_get_log_function();
              if (p_Var5 != (LOGGER_LOG)0x0) {
                (*p_Var5)(AZ_LOG_ERROR,
                          "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                          ,"StringToken_Split",0x15b,1,
                          "Failed re-allocating the token array, size=%zu",__size);
              }
              *token_count = *token_count - 1;
              iVar4 = 0x15d;
              bVar2 = false;
            }
          }
        }
        else {
          p_Var5 = xlogging_get_log_function();
          iVar4 = 0x14c;
          bVar2 = false;
          if (p_Var5 != (LOGGER_LOG)0x0) {
            (*p_Var5)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-umqtt-c/deps/c-utility/src/string_token.c"
                      ,"StringToken_Split",0x14b,1,"Unexpected token value (%p) or length (%lu)",
                      __src,__n);
          }
        }
LAB_0011679f:
      } while ((bVar2) && (_Var3 = StringToken_GetNext(token,delimiters,n_delims), _Var3));
      free(token);
      if (iVar4 == 0) {
        iVar4 = 0;
      }
      else {
        while ((sVar1 = *token_count, sVar1 != 0 && (ppcVar6 = *tokens, ppcVar6 != (char **)0x0))) {
          *token_count = sVar1 - 1;
          free(ppcVar6[sVar1 - 1]);
        }
        free(*tokens);
      }
    }
  }
  return iVar4;
}

Assistant:

int StringToken_Split(const char* source, size_t length, const char** delimiters, size_t n_delims, bool include_empty, char*** tokens, size_t* token_count)
{
    int result;

    // Codes_SRS_STRING_TOKENIZER_09_022: [ If source, delimiters, token or token_count are NULL, or n_delims is zero the function shall return a non-zero value ]
    if (source == NULL || delimiters == NULL || n_delims == 0 || tokens == NULL || token_count == NULL)
    {
        LogError("Invalid argument (source=%p, delimiters=%p, n_delims=%lu, tokens=%p, token_count=%p)", source, delimiters, (unsigned long)n_delims, tokens, token_count);
        result = MU_FAILURE;
    }
    else
    {
        STRING_TOKEN_HANDLE tokenizer;

        // Codes_SRS_STRING_TOKENIZER_09_023: [ source (up to length) shall be split into individual tokens separated by any of delimiters ]
        tokenizer = StringToken_GetFirst(source, length, delimiters, n_delims);

        *token_count = 0;
        *tokens = NULL;
        // Codes_SRS_STRING_TOKENIZER_09_027: [ If no failures occur the function shall return zero ]
        result = 0;

        if (tokenizer != NULL)
        {
            do
            {
                const char* tokenValue;
                size_t tokenLength;

                tokenValue = StringToken_GetValue(tokenizer);
                tokenLength = StringToken_GetLength(tokenizer);

                if ((tokenValue != NULL && tokenLength == 0) || (tokenValue == NULL && tokenLength > 0))
                {
                    LogError("Unexpected token value (%p) or length (%lu)", tokenValue, (unsigned long)tokenLength);
                    result = MU_FAILURE;
                    break;
                }
                // Codes_SRS_STRING_TOKENIZER_09_024: [ All NULL tokens shall be ommited if include_empty is not TRUE ]
                else if (tokenValue != NULL || include_empty)
                {
                    char** temp_token;
                    // Codes_SRS_STRING_TOKENIZER_09_025: [ The tokens shall be stored in tokens, and their count stored in token_count ]
                    *token_count = (*token_count) + 1;

                    size_t realloc_size = safe_multiply_size_t(sizeof(char*), (*token_count));
                    if (realloc_size == SIZE_MAX ||
                        (temp_token = (char**)realloc(*tokens, realloc_size)) == NULL)
                    {
                        // Codes_SRS_STRING_TOKENIZER_09_026: [ If any failures splitting or storing the tokens occur the function shall return a non-zero value ]
                        LogError("Failed re-allocating the token array, size=%zu", realloc_size);
                        (*token_count)--;
                        result = MU_FAILURE;
                        break;
                    }
                    else
                    {
                        *tokens = temp_token;
                        size_t malloc_size;
                        if (tokenLength == 0)
                        {
                            (*tokens)[(*token_count) - 1] = NULL;
                        }
                        else if ((malloc_size = safe_multiply_size_t(safe_add_size_t(tokenLength, 1), sizeof(char))) == SIZE_MAX ||
                            ((*tokens)[(*token_count) - 1] = (char*)malloc(malloc_size)) == NULL)
                        {
                            // Codes_SRS_STRING_TOKENIZER_09_026: [ If any failures splitting or storing the tokens occur the function shall return a non-zero value ]
                            LogError("Failed copying token into array, size=%zu", malloc_size);
                            *token_count = (*token_count) - 1;
                            result = MU_FAILURE;
                            break;
                        }
                        else
                        {
                            (void)memcpy((*tokens)[(*token_count) - 1], tokenValue, tokenLength);
                            (*tokens)[(*token_count) - 1][tokenLength] = '\0';
                        }
                    }
                }
            } while (StringToken_GetNext(tokenizer, delimiters, n_delims));

            StringToken_Destroy(tokenizer);

            if (result != 0)
            {
                while ((*token_count) > 0 && *tokens != NULL)
                {
                    *token_count = (*token_count) - 1;
                    free((*tokens)[*token_count]);
                }
                free(*tokens);
            }
        }
    }

    return result;
}